

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chset.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>::
test_posix(compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,char_type ch,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  bool bVar1;
  not_posix_pred pred;
  
  if ((this->posix_yes_ &
      (tr->super_cpp_regex_traits<char>).super_cpp_regex_traits_base<char,_1UL>.masks_
      [CONCAT71(0,ch)]) != 0) {
    return true;
  }
  pred.traits_ptr_ = tr;
  pred._0_8_ = CONCAT71(0,ch);
  bVar1 = any<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,boost::xpressive::detail::compound_charset<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::not_posix_pred>
                    ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      )(this->posix_no_).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start,
                     (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      )(this->posix_no_).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_finish,pred);
  return bVar1;
}

Assistant:

bool test_posix(char_type ch, Traits const &tr) const
    {
        not_posix_pred const pred = {ch, &tr};
        return tr.isctype(ch, this->posix_yes_)
            || any(this->posix_no_.begin(), this->posix_no_.end(), pred);
    }